

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall antlr::Parser::reportError(Parser *this,RecognitionException *ex)

{
  ostream *poVar1;
  char *local_28 [4];
  
  (*(ex->super_ANTLRException)._vptr_ANTLRException[2])(local_28);
  poVar1 = std::operator<<((ostream *)&std::cerr,local_28[0]);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)local_28);
  return;
}

Assistant:

void Parser::reportError(const RecognitionException& ex)
{
	ANTLR_USE_NAMESPACE(std)cerr << ex.toString().c_str() << ANTLR_USE_NAMESPACE(std)endl;
}